

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O2

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmGeneratedFileStream *fout)

{
  cmMakefile *this_00;
  bool bVar1;
  cmGlobalGenerator *pcVar2;
  char *pcVar3;
  string *psVar4;
  cmSourceGroup *pcVar5;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> *__x;
  pointer ppcVar6;
  pointer ppcVar7;
  pointer ppcVar8;
  __node_base *local_168;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string source;
  string linkName2;
  vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_> sFiles;
  string linkName;
  string local_90;
  string fullPath;
  string linkName4;
  
  std::__cxx11::string::string((string *)&linkName,"[Targets]",(allocator *)&linkName2);
  std::__cxx11::string::string((string *)&linkName2,"virtual:/virtual",(allocator *)&source);
  AppendLinkedResource(fout,&linkName,&linkName2,VirtualFolder);
  std::__cxx11::string::~string((string *)&linkName2);
  pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  for (ppcVar6 = (pcVar2->LocalGenerators).
                 super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppcVar6 !=
      (pcVar2->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppcVar6 = ppcVar6 + 1) {
    this_00 = (*ppcVar6)->Makefile;
    local_168 = &(this_00->Targets)._M_h._M_before_begin;
    while( true ) {
      local_168 = local_168->_M_nxt;
      if (local_168 == (__node_base *)0x0) break;
      std::__cxx11::string::string((string *)&linkName2,(string *)&linkName);
      std::__cxx11::string::append((char *)&linkName2);
      if (*(uint *)&local_168[0x61]._M_nxt < 5) {
        std::__cxx11::string::append((char *)&linkName2);
        std::__cxx11::string::append((string *)&linkName2);
        std::__cxx11::string::string((string *)&source,"virtual:/virtual",(allocator *)&fullPath);
        AppendLinkedResource(fout,&linkName2,&source,VirtualFolder);
        std::__cxx11::string::~string((string *)&source);
        if (this->GenerateLinkedResources != false) {
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                    (&sourceGroups,&this_00->SourceGroups);
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          std::__cxx11::string::string
                    ((string *)&fullPath,"CMAKE_BUILD_TYPE",(allocator *)&linkName4);
          pcVar3 = cmMakefile::GetSafeDefinition(this_00,&fullPath);
          std::__cxx11::string::string((string *)&source,pcVar3,(allocator *)&local_90);
          cmTarget::GetSourceFiles((cmTarget *)(local_168 + 5),&files,&source);
          std::__cxx11::string::~string((string *)&source);
          std::__cxx11::string::~string((string *)&fullPath);
          for (ppcVar7 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                         _M_impl.super__Vector_impl_data._M_start;
              pcVar5 = sourceGroups.
                       super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl.
                       super__Vector_impl_data._M_start,
              ppcVar7 !=
              files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
              super__Vector_impl_data._M_finish; ppcVar7 = ppcVar7 + 1) {
            psVar4 = cmSourceFile::GetFullPath(*ppcVar7,(string *)0x0);
            std::__cxx11::string::string((string *)&source,(string *)psVar4);
            pcVar5 = cmMakefile::FindSourceGroup(this_00,source._M_dataplus._M_p,&sourceGroups);
            cmSourceGroup::AssignSource(pcVar5,*ppcVar7);
            std::__cxx11::string::~string((string *)&source);
          }
          for (; pcVar5 != sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_finish; pcVar5 = pcVar5 + 1) {
            std::__cxx11::string::string((string *)&source,(string *)&linkName2);
            std::__cxx11::string::append((char *)&source);
            cmSourceGroup::GetFullName(pcVar5);
            std::__cxx11::string::append((char *)&source);
            std::__cxx11::string::string
                      ((string *)&fullPath,"virtual:/virtual",(allocator *)&linkName4);
            AppendLinkedResource(fout,&source,&fullPath,VirtualFolder);
            std::__cxx11::string::~string((string *)&fullPath);
            __x = cmSourceGroup::GetSourceFiles(pcVar5);
            std::vector<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::vector
                      (&sFiles,__x);
            for (ppcVar8 = sFiles.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                ppcVar8 !=
                sFiles.
                super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish; ppcVar8 = ppcVar8 + 1) {
              psVar4 = cmSourceFile::GetFullPath_abi_cxx11_(*ppcVar8);
              std::__cxx11::string::string((string *)&fullPath,(string *)psVar4);
              bVar1 = cmsys::SystemTools::FileIsDirectory(&fullPath);
              if (!bVar1) {
                std::__cxx11::string::string((string *)&linkName4,(string *)&source);
                std::__cxx11::string::append((char *)&linkName4);
                cmsys::SystemTools::GetFilenameName(&local_90,&fullPath);
                std::__cxx11::string::append((string *)&linkName4);
                std::__cxx11::string::~string((string *)&local_90);
                AppendLinkedResource(fout,&linkName4,&fullPath,LinkToFile);
                std::__cxx11::string::~string((string *)&linkName4);
              }
              std::__cxx11::string::~string((string *)&fullPath);
            }
            std::_Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>::
            ~_Vector_base(&sFiles.
                           super__Vector_base<const_cmSourceFile_*,_std::allocator<const_cmSourceFile_*>_>
                         );
            std::__cxx11::string::~string((string *)&source);
          }
          std::_Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~_Vector_base
                    (&files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector(&sourceGroups);
        }
      }
      std::__cxx11::string::~string((string *)&linkName2);
    }
    pcVar2 = (this->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  }
  std::__cxx11::string::~string((string *)&linkName);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(
                                                   cmGeneratedFileStream& fout)
{
  std::string linkName = "[Targets]";
  this->AppendLinkedResource(fout, linkName, "virtual:/virtual",VirtualFolder);

  for (std::vector<cmLocalGenerator*>::const_iterator
       lgIt = this->GlobalGenerator->GetLocalGenerators().begin();
       lgIt != this->GlobalGenerator->GetLocalGenerators().end();
       ++lgIt)
    {
    cmMakefile* makefile = (*lgIt)->GetMakefile();
    const cmTargets& targets = makefile->GetTargets();

    for(cmTargets::const_iterator ti=targets.begin(); ti!=targets.end();++ti)
      {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch(ti->second.GetType())
        {
        case cmTarget::EXECUTABLE:
        case cmTarget::STATIC_LIBRARY:
        case cmTarget::SHARED_LIBRARY:
        case cmTarget::MODULE_LIBRARY:
        case cmTarget::OBJECT_LIBRARY:
          {
          const char* prefix = (ti->second.GetType()==cmTarget::EXECUTABLE ?
                                                          "[exe] " : "[lib] ");
          linkName2 += prefix;
          linkName2 += ti->first;
          this->AppendLinkedResource(fout, linkName2, "virtual:/virtual",
                                     VirtualFolder);
          if (!this->GenerateLinkedResources)
            {
            break; // skip generating the linked resources to the source files
            }
          std::vector<cmSourceGroup> sourceGroups=makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmTarget* tgt = const_cast<cmTarget*>(&ti->second);
          std::vector<cmSourceFile*> files;
          tgt->GetSourceFiles(files,
                            makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for(std::vector<cmSourceFile*>::const_iterator sfIt = files.begin();
              sfIt != files.end();
              sfIt++)
            {
            // Add the file to the list of sources.
            std::string source = (*sfIt)->GetFullPath();
            cmSourceGroup* sourceGroup =
                       makefile->FindSourceGroup(source.c_str(), sourceGroups);
            sourceGroup->AssignSource(*sfIt);
            }

          for(std::vector<cmSourceGroup>::iterator sgIt = sourceGroups.begin();
              sgIt != sourceGroups.end();
              ++sgIt)
            {
            std::string linkName3 = linkName2;
            linkName3 += "/";
            linkName3 += sgIt->GetFullName();
            this->AppendLinkedResource(fout, linkName3, "virtual:/virtual",
                                       VirtualFolder);

            std::vector<const cmSourceFile*> sFiles = sgIt->GetSourceFiles();
            for(std::vector<const cmSourceFile*>::const_iterator fileIt =
                                                                sFiles.begin();
                fileIt != sFiles.end();
                ++fileIt)
              {
              std::string fullPath = (*fileIt)->GetFullPath();
              if (!cmSystemTools::FileIsDirectory(fullPath))
                {
                std::string linkName4 = linkName3;
                linkName4 += "/";
                linkName4 += cmSystemTools::GetFilenameName(fullPath);
                this->AppendLinkedResource(fout, linkName4,
                                           fullPath, LinkToFile);
                }
              }
            }
          }
          break;
        // ignore all others:
        default:
          break;
        }
      }
    }
}